

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::
printSequentialContainer<std::vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>>
          (QtPrivate *this,QDebug debug,char *which,
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          *c)

{
  long lVar1;
  pointer puVar2;
  undefined8 uVar3;
  QDebug *pQVar4;
  __uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *entry;
  QDebug debug_00;
  pointer puVar5;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> local_60 [2]
  ;
  __uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  puVar5 = (c->
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (c->
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 == puVar2) goto LAB_00268780;
  local_50._M_t.
  super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>.
  super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl =
       *(tuple<QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_> *)
        debug.stream;
  entry = &local_50;
  *(int *)((long)local_50._M_t.
                 super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
                 .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl + 0x28) =
       *(int *)((long)local_50._M_t.
                      super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
                      .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl + 0x28) +
       1;
  debug_00.stream = (Stream *)local_48;
  while( true ) {
    ::operator<<(debug_00,(unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                           *)entry);
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug((QDebug *)entry);
    puVar5 = puVar5 + 1;
LAB_00268780:
    if (puVar5 == puVar2) break;
    pQVar4 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60[0]._M_t.
    super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>.
    super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl =
         (tuple<QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>)
         pQVar4->stream;
    entry = local_60;
    *(int *)((long)local_60[0]._M_t.
                   super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
                   .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl + 0x28) =
         *(int *)((long)local_60[0]._M_t.
                        super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
                        .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl + 0x28)
         + 1;
    debug_00.stream = (Stream *)(local_60 + 1);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}